

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O2

bool P_CheckKeys(AActor *owner,int keynum,bool remote)

{
  Lock *pLVar1;
  bool bVar2;
  AActor *pAVar3;
  char *msg;
  FSoundID *pFVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  FSoundID local_40;
  FSoundID failage [2];
  FSoundID local_34;
  
  if (owner == (AActor *)0x0) {
    return false;
  }
  bVar2 = true;
  if (0xffffff00 < keynum - 0x100U) {
    if (keysdone == '\0') {
      P_InitKeyMessages();
    }
    failage[0].ID = S_FindSound("*keytry");
    failage[1].ID = S_FindSound("misc/keytry");
    if (locks[(uint)keynum] == (Lock *)0x0) {
      uVar6 = 2;
      pFVar4 = failage;
      if ((keynum == 0x67) && (((byte)gameinfo.flags & 2) != 0)) {
        msg = "$TXT_RETAIL_ONLY";
      }
      else {
        msg = "$TXT_DOES_NOT_WORK";
      }
    }
    else {
      bVar2 = Lock::check(locks[(uint)keynum],owner);
      if (bVar2) {
        return true;
      }
      pLVar1 = locks[(uint)keynum];
      msg = (&pLVar1->Message)[remote].Chars;
      pFVar4 = (pLVar1->locksound).Array;
      uVar6 = (pLVar1->locksound).Count;
    }
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
    if (pAVar3 == owner) {
      if (msg != (char *)0x0) {
        if (*msg == '$') {
          msg = FStringTable::operator()(&GStrings,msg + 1);
        }
        C_MidPrint(SmallFont,msg);
      }
      uVar5 = 0;
      uVar7 = (ulong)uVar6;
      if ((int)uVar6 < 1) {
        uVar7 = uVar5;
      }
      for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        local_40.ID = pFVar4[uVar5].ID;
        if ((local_40.ID != 0) &&
           (local_34.ID = S_FindSkinnedSound(owner,&local_40), local_34.ID != 0)) {
          S_Sound(owner,2,&local_34,1.0,1.0);
          break;
        }
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool P_CheckKeys (AActor *owner, int keynum, bool remote)
{
	const char *failtext = NULL;
	FSoundID *failsound;
	int numfailsounds;

	if (owner == NULL) return false;
	if (keynum<=0 || keynum>255) return true;
	// Just a safety precaution. The messages should have been initialized upon game start.
	if (!keysdone) P_InitKeyMessages();

	FSoundID failage[2] = { "*keytry", "misc/keytry" };

	if (!locks[keynum]) 
	{
		if (keynum == 103 && (gameinfo.flags & GI_SHAREWARE))
			failtext = "$TXT_RETAIL_ONLY";
		else
			failtext = "$TXT_DOES_NOT_WORK";

		failsound = failage;
		numfailsounds = countof(failage);
	}
	else
	{
		if (locks[keynum]->check(owner)) return true;
		failtext = remote? locks[keynum]->RemoteMsg : locks[keynum]->Message;
		failsound = &locks[keynum]->locksound[0];
		numfailsounds = locks[keynum]->locksound.Size();
	}

	// If we get here, that means the actor isn't holding an appropriate key.

	if (owner == players[consoleplayer].camera)
	{
		PrintMessage(failtext);

		// Play the first defined key sound.
		for (int i = 0; i < numfailsounds; ++i)
		{
			if (failsound[i] != 0)
			{
				int snd = S_FindSkinnedSound(owner, failsound[i]);
				if (snd != 0)
				{
					S_Sound (owner, CHAN_VOICE, snd, 1, ATTN_NORM);
					break;
				}
			}
		}
	}

	return false;
}